

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

SMatrix<double,_3,_3> *
gmath::operator*(SMatrix<double,_3,_3> *__return_storage_ptr__,SMatrix<double,_3,_3> *a,
                SMatrix<double,_3,_3> *b)

{
  int k;
  long lVar1;
  double (*padVar2) [3];
  long lVar3;
  double (*padVar4) [3];
  int j;
  long lVar5;
  double dVar6;
  
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    padVar2 = (double (*) [3])b;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar6 = 0.0;
      padVar4 = padVar2;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        dVar6 = dVar6 + (*(double (*) [3])*(double (*) [3])a)[lVar5] *
                        (*(double (*) [3])*padVar4)[0];
        padVar4 = padVar4 + 1;
      }
      __return_storage_ptr__->v[lVar1][lVar3] = dVar6;
      padVar2 = (double (*) [3])(*padVar2 + 1);
    }
    a = (SMatrix<double,_3,_3> *)((long)a + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline SMatrix<T, n, m> operator*(const SMatrix<T, n, u> &a,
    const SMatrix<T, u, m> &b)
{
  SMatrix<T, n, m> ret;

  for (int k=0; k<n; k++)
  {
    for (int i=0; i<m; i++)
    {
      ret(k, i)=0;

      for (int j=0; j<u; j++)
      {
        ret(k, i)+=a(k, j)*b(j, i);
      }
    }
  }

  return ret;
}